

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseLambdaCall(Parser *this,bool lParenSkipped)

{
  Mark *pMVar1;
  Node *this_00;
  byte in_DL;
  Tokenizer *in_RSI;
  _Head_base<0UL,_ExpressionNode_*,_false> in_RDI;
  type func;
  Token token;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> arguments
  ;
  unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_> lambda;
  Mark mark;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *node;
  Token *in_stack_fffffffffffffe88;
  Token *in_stack_fffffffffffffe90;
  Token *in_stack_fffffffffffffe98;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  *in_stack_fffffffffffffea0;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined8 in_stack_ffffffffffffff10;
  int local_e8;
  TokenType in_stack_ffffffffffffff1c;
  Mark in_stack_ffffffffffffff20;
  Parser *in_stack_ffffffffffffff78;
  string local_80 [63];
  allocator<char> local_41;
  string local_40 [8];
  Parser *in_stack_ffffffffffffffc8;
  Mark local_1c;
  byte local_11;
  
  local_11 = in_DL & 1;
  pMVar1 = Tokenizer::getMark((Tokenizer *)0x19d681);
  local_1c = *pMVar1;
  if ((local_11 & 1) == 0) {
    in_stack_fffffffffffffed0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    expectToken((Parser *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                (string *)in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  parseLambda(in_stack_ffffffffffffff78);
  __s = &stack0xffffffffffffff7f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,__s,in_stack_fffffffffffffec0);
  expectToken((Parser *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
              (string *)in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  parseCallArgumentList_abi_cxx11_(in_stack_ffffffffffffffc8);
  std::
  make_unique<LambdaCallNode,std::unique_ptr<LambdaNode,std::default_delete<LambdaNode>>,std::__cxx11::list<std::shared_ptr<ExpressionNode>,std::allocator<std::shared_ptr<ExpressionNode>>>>
            ((unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_> *)in_RSI,
             (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)in_RDI._M_head_impl);
  std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::
  unique_ptr<LambdaCallNode,std::default_delete<LambdaCallNode>,void>
            ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
             in_stack_fffffffffffffea0,
             (unique_ptr<LambdaCallNode,_std::default_delete<LambdaCallNode>_> *)
             in_stack_fffffffffffffe98);
  std::unique_ptr<LambdaCallNode,_std::default_delete<LambdaCallNode>_>::~unique_ptr
            ((unique_ptr<LambdaCallNode,_std::default_delete<LambdaCallNode>_> *)
             in_stack_fffffffffffffe90);
  Tokenizer::peek(in_RSI);
  Token::Token(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  while (local_e8 == 0x29) {
    parseCallArgumentList_abi_cxx11_(in_stack_ffffffffffffffc8);
    in_stack_fffffffffffffea0 =
         (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *
         )&stack0xffffffffffffff00;
    std::__cxx11::
    list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
    operator=(in_stack_fffffffffffffea0,
              (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
               *)in_stack_fffffffffffffe98);
    std::__cxx11::
    list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::~list
              ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)0x19d87f);
    std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::unique_ptr
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe90,
               (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe88);
    std::
    make_unique<FunctionResultCallNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>,std::__cxx11::list<std::shared_ptr<ExpressionNode>,std::allocator<std::shared_ptr<ExpressionNode>>>>
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)in_RSI,
               (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)in_RDI._M_head_impl);
    in_stack_fffffffffffffe90 = (Token *)&stack0xfffffffffffffef0;
    std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::operator=
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffea0,
               (unique_ptr<FunctionResultCallNode,_std::default_delete<FunctionResultCallNode>_> *)
               in_stack_fffffffffffffe98);
    std::unique_ptr<FunctionResultCallNode,_std::default_delete<FunctionResultCallNode>_>::
    ~unique_ptr((unique_ptr<FunctionResultCallNode,_std::default_delete<FunctionResultCallNode>_> *)
                in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe98 = Tokenizer::peek(in_RSI);
    Token::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe90);
  }
  this_00 = &std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::operator->
                       ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)0x19d9cf
                       )->super_Node;
  Node::setMark(this_00,&local_1c);
  Token::~Token((Token *)0x19d9f6);
  std::__cxx11::
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::~list
            ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)0x19da28);
  std::unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_>::~unique_ptr
            ((unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_> *)in_stack_fffffffffffffea0);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (tuple<ExpressionNode_*,_std::default_delete<ExpressionNode>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseLambdaCall(bool lParenSkipped)
{
  const auto mark = tokenizer_.getMark();
  if(!lParenSkipped)
    expectToken(TokenType::LParen, "Expected open parenthesis!");
  
  auto lambda = parseLambda();
  expectToken(TokenType::RParen, "Expected closing parenthesis!");

  auto arguments = parseCallArgumentList();
  std::unique_ptr<ExpressionNode> node = std::make_unique<LambdaCallNode>(std::move(lambda), std::move(arguments));

  auto token = tokenizer_.peek();
  while(token.type == TokenType::LParen)
  {
    arguments = parseCallArgumentList();
    auto func = std::move(node);
    node = std::make_unique<FunctionResultCallNode>(std::move(func), std::move(arguments));
    token = tokenizer_.peek();
  }
  node->setMark(mark);
  return node;
}